

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_traversal_sequencer.h
# Opt level: O3

bool __thiscall
draco::
MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
::UpdatePointToAttributeIndexMapping
          (MeshTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>_>
           *this,PointAttribute *attribute)

{
  uint uVar1;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar2;
  uint uVar3;
  CornerTable *pCVar4;
  Mesh *pMVar5;
  MeshAttributeIndicesEncodingData *pMVar6;
  pointer paVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int p;
  ulong uVar13;
  bool bVar14;
  
  pCVar4 = (this->traverser_).
           super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           .corner_table_;
  uVar8 = (this->mesh_->super_PointCloud).num_points_;
  attribute->identity_mapping_ = false;
  std::
  vector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ::resize(&(attribute->indices_map_).vector_,(ulong)uVar8,
           (value_type *)&kInvalidAttributeValueIndex);
  pMVar5 = this->mesh_;
  paVar7 = (pMVar5->faces_).vector_.
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (int)((ulong)((long)(pMVar5->faces_).vector_.
                              super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar7) >> 2) *
          -0x55555555;
  if (uVar8 != 0) {
    uVar1 = (pMVar5->super_PointCloud).num_points_;
    iVar10 = 0;
    uVar11 = 0xffffffff;
    bVar14 = false;
    uVar12 = 0;
    do {
      pMVar6 = this->encoding_data_;
      uVar13 = 0;
      do {
        if (uVar11 == uVar13) {
          return bVar14;
        }
        uVar9 = (ulong)(pCVar4->corner_to_vertex_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(uint)(iVar10 + (int)uVar13)].
                       value_;
        if (uVar9 == 0xffffffff) {
          return bVar14;
        }
        IVar2.value_ = paVar7->_M_elems[uVar13].value_;
        if (uVar1 <= IVar2.value_) {
          return bVar14;
        }
        uVar3 = (pMVar6->vertex_to_encoded_attribute_value_index_map).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar9];
        if (uVar1 <= uVar3) {
          return bVar14;
        }
        (attribute->indices_map_).vector_.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[IVar2.value_].value_ = uVar3;
        uVar13 = uVar13 + 1;
      } while (uVar13 != 3);
      uVar12 = uVar12 + 1;
      uVar11 = uVar11 - 3;
      iVar10 = iVar10 + 3;
      paVar7 = paVar7 + 1;
      bVar14 = uVar8 <= uVar12;
    } while (uVar12 != uVar8);
  }
  return true;
}

Assistant:

bool UpdatePointToAttributeIndexMapping(PointAttribute *attribute) override {
    const auto *corner_table = traverser_.corner_table();
    attribute->SetExplicitMapping(mesh_->num_points());
    const size_t num_faces = mesh_->num_faces();
    const size_t num_points = mesh_->num_points();
    for (FaceIndex f(0); f < static_cast<uint32_t>(num_faces); ++f) {
      const auto &face = mesh_->face(f);
      for (int p = 0; p < 3; ++p) {
        const PointIndex point_id = face[p];
        const VertexIndex vert_id =
            corner_table->Vertex(CornerIndex(3 * f.value() + p));
        if (vert_id == kInvalidVertexIndex) {
          return false;
        }
        const AttributeValueIndex att_entry_id(
            encoding_data_
                ->vertex_to_encoded_attribute_value_index_map[vert_id.value()]);
        if (point_id >= num_points || att_entry_id.value() >= num_points) {
          // There cannot be more attribute values than the number of points.
          return false;
        }
        attribute->SetPointMapEntry(point_id, att_entry_id);
      }
    }
    return true;
  }